

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

wchar_t ui_entry_renderer_customize(wchar_t ind,char *colors,char *label_colors,char *symbols)

{
  size_t sVar1;
  wchar_t *dest;
  size_t sVar2;
  wchar_t local_6c;
  wchar_t local_54;
  wchar_t local_44;
  wchar_t *tmp;
  size_t length;
  char *symbols_local;
  char *label_colors_local;
  char *colors_local;
  wchar_t ind_local;
  
  if ((ind < L'\x01') || (renderer_count < ind)) {
    colors_local._4_4_ = L'\x01';
  }
  else {
    if (colors != (char *)0x0) {
      sVar1 = strlen(colors);
      if (sVar1 < (ulong)(long)renderers[ind + L'\xffffffff'].ncolors) {
        local_44 = (wchar_t)sVar1;
      }
      else {
        local_44 = renderers[ind + L'\xffffffff'].ncolors;
      }
      convert_chars_to_attrs(colors,local_44,renderers[ind + L'\xffffffff'].colors);
    }
    if (label_colors != (char *)0x0) {
      sVar1 = strlen(label_colors);
      if (sVar1 < (ulong)(long)renderers[ind + L'\xffffffff'].ncolors) {
        local_54 = (wchar_t)sVar1;
      }
      else {
        local_54 = renderers[ind + L'\xffffffff'].ncolors;
      }
      convert_chars_to_attrs(label_colors,local_54,renderers[ind + L'\xffffffff'].label_colors);
    }
    if (symbols != (char *)0x0) {
      dest = (wchar_t *)mem_alloc((long)(renderers[ind + L'\xffffffff'].nsym + L'\x01') << 2);
      sVar2 = text_mbstowcs(dest,symbols,renderers[ind + L'\xffffffff'].nsym + L'\x01');
      if (sVar2 == 0xffffffffffffffff) {
        return L'\x01';
      }
      local_6c = (wchar_t)sVar2;
      if (renderers[ind + L'\xffffffff'].nsym <= local_6c) {
        local_6c = renderers[ind + L'\xffffffff'].nsym;
      }
      memcpy(renderers[ind + L'\xffffffff'].symbols,dest,(long)local_6c << 2);
      mem_free(dest);
    }
    colors_local._4_4_ = L'\0';
  }
  return colors_local._4_4_;
}

Assistant:

int ui_entry_renderer_customize(int ind, const char *colors,
	const char *label_colors, const char *symbols)
{
	size_t length;

	if (ind <= 0 || ind > renderer_count) {
		return 1;
	}
	if (colors != 0) {
		length = strlen(colors);
		convert_chars_to_attrs(colors,
			(length < (size_t) renderers[ind - 1].ncolors) ?
			(int) length : renderers[ind - 1].ncolors,
			renderers[ind - 1].colors);
	}
	if (label_colors != 0) {
		length = strlen(label_colors);
		convert_chars_to_attrs(label_colors,
			(length < (size_t) renderers[ind - 1].ncolors) ?
			(int) length : renderers[ind - 1].ncolors,
			renderers[ind - 1].label_colors);
	}
	if (symbols != 0) {
		wchar_t *tmp = mem_alloc((renderers[ind - 1].nsym + 1) *
			sizeof(*tmp));

		length = text_mbstowcs(tmp, symbols,
			renderers[ind - 1].nsym + 1);
		if (length == (size_t)-1) {
			return 1;
		}
		(void) memcpy(renderers[ind - 1].symbols, tmp,
			(((int)length < renderers[ind - 1].nsym) ?
			(int)length : renderers[ind - 1].nsym) *
			sizeof(*renderers[ind - 1].symbols));
		mem_free(tmp);
	}
	return 0;
}